

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool __thiscall ON_NurbsCage::GetCV(ON_NurbsCage *this,int i,int j,int k,ON_4dPoint *point)

{
  double *pdVar1;
  double local_58;
  double local_50;
  double local_48;
  double *cv;
  bool rc;
  ON_4dPoint *point_local;
  int k_local;
  int j_local;
  int i_local;
  ON_NurbsCage *this_local;
  
  cv._7_1_ = false;
  pdVar1 = CV(this,i,j,k);
  if (pdVar1 != (double *)0x0) {
    point->x = *pdVar1;
    if (this->m_dim < 2) {
      local_48 = 0.0;
    }
    else {
      local_48 = pdVar1[1];
    }
    point->y = local_48;
    if (this->m_dim < 3) {
      local_50 = 0.0;
    }
    else {
      local_50 = pdVar1[2];
    }
    point->z = local_50;
    if ((this->m_is_rat & 1U) == 0) {
      local_58 = 1.0;
    }
    else {
      local_58 = pdVar1[this->m_dim];
    }
    point->w = local_58;
    cv._7_1_ = true;
  }
  return cv._7_1_;
}

Assistant:

bool ON_NurbsCage::GetCV( int i, int j, int k, ON_4dPoint& point ) const
{
  bool rc = false;
  const double* cv = CV(i,j,k);
  if ( cv ) {
    point.x = cv[0];
    point.y = (m_dim>1)? cv[1] : 0.0;
    point.z = (m_dim>2)? cv[2] : 0.0;
    point.w = (m_is_rat) ? cv[m_dim] : 1.0;
    rc = true;
  }
  return rc;
}